

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3443::PrecomputeInternalForceMatricesWeightsContInt
          (ChElementShellANCF_3443 *this)

{
  double dVar1;
  double thickness;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  Scalar *pSVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  Matrix<double,__1,__1,_1,__1,__1> *this_00;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  ChMatrix33<double> J_0xi;
  ChMatrixNM<double,_NSF,_3>_conflict3 SD_precompute_D;
  MatrixNx3c Sxi_D;
  Product<Eigen::Matrix<double,_16,_3,_0,_16,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
  local_430 [3];
  BlockImpl_dense<Eigen::Matrix<double,_16,_3,_1,_16,_3>,_16,_1,_false,_true> local_3f8;
  Matrix<double,_3,_3,_1,_3,_3> local_3c8;
  Matrix<double,_16,_3,_1,_16,_3> local_380;
  MatrixNx3c local_200;
  undefined1 extraout_var [56];
  
  this_00 = &this->m_SD;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,0x10,
             (long)(this->m_numLayers * 0x60));
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&(this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (long)this->m_numLayers << 5,1);
  for (uVar13 = 0; uVar13 < (ulong)(long)this->m_numLayers; uVar13 = uVar13 + 1) {
    dVar1 = this->m_thicknessZ;
    thickness = (this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar13].m_thickness;
    dVar2 = (this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar13];
    lVar7 = uVar13 * 0x60;
    dVar3 = this->m_midsurfoffset;
    lVar11 = *(long *)(DAT_011df648 + 0x48);
    lVar19 = *(long *)(DAT_011df648 + 0x50);
    lVar8 = DAT_011df648;
    for (uVar14 = 0; uVar15 = (ulong)uVar14, uVar15 < (ulong)(lVar19 - lVar11 >> 3);
        uVar14 = uVar14 + 1) {
      for (uVar16 = 0; uVar17 = (ulong)uVar16, uVar17 < (ulong)(lVar19 - lVar11 >> 3);
          uVar16 = uVar16 + 1) {
        uVar10 = 0;
        while( true ) {
          uVar18 = (ulong)uVar10;
          uVar12 = *(long *)(lVar8 + 0x20) - *(long *)(lVar8 + 0x18) >> 3;
          if (uVar12 <= uVar18) break;
          dVar4 = *(double *)(*(long *)(static_tables_3443 + 0x48) + uVar15 * 8);
          dVar5 = *(double *)(*(long *)(static_tables_3443 + 0x48) + uVar17 * 8);
          lVar11 = *(long *)(lVar8 + 0x48);
          dVar6 = *(double *)(*(long *)(static_tables_3443 + 0x18) + uVar18 * 8);
          lVar19 = ((*(long *)(lVar8 + 0x50) - lVar11 >> 3) * uVar15 + uVar17) * uVar12 + uVar18;
          Calc_Sxi_D(this,&local_200,*(double *)(lVar11 + uVar15 * 8),
                     *(double *)(lVar11 + uVar17 * 8),
                     *(double *)(*(long *)(lVar8 + 0x18) + uVar18 * 8),thickness,
                     thickness * 0.5 + (dVar2 - dVar1 * 0.5) + dVar3);
          local_430[0].m_lhs = (LhsNested)&this->m_ebar0;
          local_430[0].m_rhs.m_xpr = (XprTypeNested)&local_200;
          local_3f8.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_16,_3,_1,_16,_3>,_16,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_16,_3,_1,_16,_3>,_16,_1,_false>,_0>.
          m_data = (PointerType)&local_3c8;
          Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
                    ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)&local_3f8,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_3,_0,_16,_3>,_0>_>
                      *)local_430);
          local_430[0].m_lhs = &local_200;
          local_430[0].m_rhs.m_xpr = &local_3c8;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,16,3,1,16,3>,Eigen::Product<Eigen::Matrix<double,16,3,0,16,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
                    (&local_380,local_430);
          auVar21._0_8_ =
               Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                         (&local_3c8);
          auVar21._8_56_ = extraout_var;
          auVar20._8_8_ = 0x8000000000000000;
          auVar20._0_8_ = 0x8000000000000000;
          auVar20 = vxorpd_avx512vl(auVar21._0_16_,auVar20);
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                              &this->m_kGQ,lVar19 + uVar13 * 0x20);
          *pSVar9 = auVar20._0_8_ * dVar4 * dVar5 * dVar6;
          Eigen::internal::
          BlockImpl_dense<Eigen::Matrix<double,_16,_3,_1,_16,_3>,_16,_1,_false,_true>::
          BlockImpl_dense(&local_3f8,&local_380,0);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_430,
                     this_00,lVar19 + lVar7);
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,16,3,1,16,3>,16,1,false>>
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_430,
                     (Block<Eigen::Matrix<double,_16,_3,_1,_16,_3>,_16,_1,_false> *)&local_3f8);
          Eigen::internal::
          BlockImpl_dense<Eigen::Matrix<double,_16,_3,_1,_16,_3>,_16,_1,_false,_true>::
          BlockImpl_dense(&local_3f8,&local_380,1);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_430,
                     this_00,lVar7 + 0x20 + lVar19);
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,16,3,1,16,3>,16,1,false>>
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_430,
                     (Block<Eigen::Matrix<double,_16,_3,_1,_16,_3>,_16,_1,_false> *)&local_3f8);
          Eigen::internal::
          BlockImpl_dense<Eigen::Matrix<double,_16,_3,_1,_16,_3>,_16,_1,_false,_true>::
          BlockImpl_dense(&local_3f8,&local_380,2);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_430,
                     this_00,lVar7 + 0x40 + lVar19);
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,16,3,1,16,3>,16,1,false>>
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_430,
                     (Block<Eigen::Matrix<double,_16,_3,_1,_16,_3>,_16,_1,_false> *)&local_3f8);
          uVar10 = uVar10 + 1;
          lVar8 = DAT_011df648;
        }
        lVar11 = *(long *)(lVar8 + 0x48);
        lVar19 = *(long *)(lVar8 + 0x50);
      }
    }
  }
  return;
}

Assistant:

void ChElementShellANCF_3443::PrecomputeInternalForceMatricesWeightsContInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta = NP - 1;  // Gauss-Quadrature table index for xi and eta
    unsigned int GQ_idx_zeta = NT - 1;    // Gauss-Quadrature table index for zeta

    m_SD.resize(NSF, 3 * m_numLayers * NIP);
    m_kGQ.resize(m_numLayers * NIP, 1);

    ChMatrixNM<double, NSF, 3> SD_precompute_D;

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        double thickness = m_layers[kl].Get_thickness();
        double layer_midsurface_offset = -m_thicknessZ / 2 + m_layer_zoffsets[kl] + thickness / 2 + m_midsurfoffset;

        for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta].size(); it_xi++) {
            for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta].size(); it_eta++) {
                for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_zeta].size(); it_zeta++) {
                    double GQ_weight = GQTable->Weight[GQ_idx_xi_eta][it_xi] * GQTable->Weight[GQ_idx_xi_eta][it_eta] *
                                       GQTable->Weight[GQ_idx_zeta][it_zeta];
                    double xi = GQTable->Lroots[GQ_idx_xi_eta][it_xi];
                    double eta = GQTable->Lroots[GQ_idx_xi_eta][it_eta];
                    double zeta = GQTable->Lroots[GQ_idx_zeta][it_zeta];
                    auto index = it_zeta + it_eta * GQTable->Lroots[GQ_idx_zeta].size() +
                                 it_xi * GQTable->Lroots[GQ_idx_zeta].size() * GQTable->Lroots[GQ_idx_xi_eta].size();
                    ChMatrix33<double>
                        J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
                    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                    Calc_Sxi_D(Sxi_D, xi, eta, zeta, thickness, layer_midsurface_offset);
                    J_0xi.noalias() = m_ebar0 * Sxi_D;

                    // Adjust the shape function derivative matrix to account for a potentially deformed reference state
                    SD_precompute_D = Sxi_D * J_0xi.inverse();
                    m_kGQ((kl * NIP) + index) = -J_0xi.determinant() * GQ_weight;

                    // Group all of the columns together in blocks, and then layer by layer across the entire element
                    m_SD.col((3 * kl * NIP) + index) = SD_precompute_D.col(0);
                    m_SD.col((3 * kl * NIP) + index + NIP) = SD_precompute_D.col(1);
                    m_SD.col((3 * kl * NIP) + index + 2 * NIP) = SD_precompute_D.col(2);
                }
            }
        }
    }
}